

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O2

Polynomial<double> __thiscall gmath::Polynomial<double>::operator-(Polynomial<double> *this)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  long in_RSI;
  ulong uVar5;
  Polynomial<double> PVar6;
  
  Polynomial(this);
  increase(this,*(int *)(in_RSI + 4));
  uVar1 = *(uint *)(in_RSI + 4);
  this->used = uVar1;
  lVar2 = *(long *)(in_RSI + 8);
  pdVar3 = this->c;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pdVar3[uVar5] = -*(double *)(lVar2 + uVar5 * 8);
  }
  PVar6.c = pdVar3;
  PVar6._0_8_ = this;
  return PVar6;
}

Assistant:

Polynomial<T> operator-() const
    {
      Polynomial<T> ret;

      ret.increase(used);
      ret.used=used;

      for (int i=0; i<used; i++)
      {
        ret.c[i]=-c[i];
      }

      return ret;
    }